

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_write_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  ws_frame *frame;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    frame = (ws_frame *)nni_aio_get_prov_data(aio);
    if (frame == *(ws_frame **)((long)arg + 0xe8)) {
      nni_aio_abort((nni_aio *)((long)arg + 0xf8),rv);
    }
    else {
      nni_list_remove((nni_list *)((long)arg + 0xb8),frame);
      frame->aio = (nng_aio *)0x0;
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,rv);
      ws_frame_fini(frame);
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return;
}

Assistant:

static void
ws_write_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_ws   *ws = arg;
	ws_frame *frame;

	// Is this aio active?  We can tell by looking at the active tx frame.

	nni_mtx_lock(&ws->mtx);
	if (!nni_aio_list_active(aio)) {
		nni_mtx_unlock(&ws->mtx);
		return;
	}
	frame = nni_aio_get_prov_data(aio);
	if (frame == ws->txframe) {
		nni_aio_abort(&ws->txaio, rv);
		// We will wait for callback on the txaio to finish aio.
	} else {
		// If scheduled, just need to remove node and complete it.
		nni_list_remove(&ws->txq, frame);
		frame->aio = NULL;
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
		ws_frame_fini(frame);
	}
	nni_mtx_unlock(&ws->mtx);
}